

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::FormulasLoader::begin__bool(FormulasLoader *this)

{
  String *name;
  FormulaNewParam *in_RDI;
  
  if (((ulong)in_RDI[5]._vptr_FormulaNewParam & 0x10000) != 0) {
    name = (String *)operator_new(0x38);
    COLLADAFW::FormulaNewParam::FormulaNewParam(in_RDI,(ValueType)((ulong)name >> 0x20));
    *(String **)&in_RDI[5].mValueType = name;
    COLLADAFW::FormulaNewParam::setName(in_RDI,name);
  }
  return true;
}

Assistant:

bool FormulasLoader::begin__bool()
	{
		if ( mWithinNewParam )
		{
			mCurrentFormulaNewParam = FW_NEW COLLADAFW::FormulaNewParam(COLLADAFW::FormulaNewParam::VALUETYPE_BOOL);
			mCurrentFormulaNewParam->setName(mCurrentFormulaNewParamSid);
		}
		return true;
	}